

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

int __thiscall
vkt::sr::anon_unknown_0::ConstantDerivateCaseInstance::verify
          (ConstantDerivateCaseInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  DerivateCaseValues *pDVar1;
  bool bVar2;
  undefined7 extraout_var;
  Vec4 reference;
  tcu local_60 [16];
  undefined1 local_50 [16];
  Vec4 threshold;
  
  tcu::Vector<float,_4>::Vector(&reference,0.0);
  TriangleDerivateCaseInstance::getSurfaceThreshold((TriangleDerivateCaseInstance *)local_50);
  tcu::abs<float,4>(local_60,&((this->super_TriangleDerivateCaseInstance).m_values)->derivScale);
  tcu::operator/((tcu *)&threshold,(Vector<float,_4> *)local_50,(Vector<float,_4> *)local_60);
  pDVar1 = (this->super_TriangleDerivateCaseInstance).m_values;
  bVar2 = verifyConstantDerivate
                    (((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                      super_TestInstance.m_context)->m_testCtx->m_log,(ConstPixelBufferAccess *)ctx,
                     (PixelBufferAccess *)sig,
                     ((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType,&reference
                     ,&threshold,&pDVar1->derivScale,&pDVar1->derivBias,LOG_ALL);
  return (int)CONCAT71(extraout_var,bVar2);
}

Assistant:

bool ConstantDerivateCaseInstance::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4 reference	(0.0f); // Derivate of constant argument should always be 0
	const tcu::Vec4	threshold	= getSurfaceThreshold() / abs(m_values.derivScale);

	return verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
								  reference, threshold, m_values.derivScale, m_values.derivBias);
}